

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O0

int main(void)

{
  undefined1 local_30 [8];
  clinet app;
  
  app._28_4_ = 0;
  clinet::clinet((clinet *)local_30);
  clinet::run((clinet *)local_30);
  printf("exit\n");
  return 0;
}

Assistant:

int main()
{
    clinet app;
    app.run();
    printf("exit\n");
    return 0;
}